

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  DWORD DVar4;
  DWORD DVar5;
  __pid_t __pid;
  int iVar6;
  __pid_t _Var7;
  int *piVar8;
  size_t sVar9;
  FILE *pFVar10;
  char **ppcVar11;
  uint testIdx;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  TLabTest TVar15;
  uint local_210;
  uint local_20c;
  char *local_208;
  timespec local_200;
  rusage rusage;
  sigaction local_160;
  sigaction local_c8;
  
  local_208 = *argv;
  ppcVar11 = argv;
  if (argc < 3) goto LAB_00102721;
  pcVar13 = argv[1];
  if (((*pcVar13 == '-') && (pcVar13[1] == 'a')) && (pcVar13[2] == '\0')) {
    argv = argv + 1;
    UserTestAll = '\x01';
    argc = argc - 1;
  }
  ppcVar11 = argv;
  if ((uint)argc < 4) {
LAB_0010287b:
    if ((uint)argc < 3) {
      argc = 2;
      goto LAB_00102721;
    }
    pcVar13 = ppcVar11[1];
    if (*pcVar13 != '-') goto LAB_00102721;
  }
  else {
    pcVar13 = argv[1];
    if (*pcVar13 != '-') goto LAB_00102721;
    if (((pcVar13[1] == 'm') && (pcVar13[2] == '\0')) && (iVar1 = atoi(argv[2]), iVar1 != 0)) {
      ppcVar11 = argv + 2;
      UserMemoryLimit = iVar1 << 10;
      argc = argc - 2;
      if ((uint)argc < 4) goto LAB_0010287b;
      pcVar13 = argv[3];
      argv = ppcVar11;
      if (*pcVar13 != '-') goto LAB_00102721;
    }
    ppcVar11 = argv;
    if (((pcVar13[1] == 't') && (pcVar13[2] == '\0')) && (iVar1 = atoi(argv[2]), iVar1 != 0)) {
      argc = argc - 2;
      ppcVar11 = argv + 2;
      UserTimeout = iVar1;
      goto LAB_0010287b;
    }
  }
  if ((pcVar13[1] == 'e') && (pcVar13[2] == '\0')) {
    pcVar13 = ppcVar11[2];
    memset(&local_c8.sa_mask,0,0x90);
    local_c8.__sigaction_handler.sa_handler = SigchldTrap;
    sigemptyset(&local_c8.sa_mask);
    local_c8.sa_flags = 1;
    iVar1 = sigaction(0x11,&local_c8,&local_160);
    if (iVar1 == 0) {
      fflush(_stdout);
      iVar1 = access(".",7);
      if (iVar1 == -1) {
        pcVar13 = "access";
      }
      else {
        __pid = fork();
        if (__pid != -1) {
          if (__pid == 0) {
            pFVar10 = freopen("in.txt","r",_stdin);
            if ((pFVar10 == (FILE *)0x0) ||
               (pFVar10 = freopen("out.txt","w",_stdout), pFVar10 == (FILE *)0x0)) {
              pcVar13 = "freopen";
            }
            else {
              iVar1 = execl(pcVar13,pcVar13,0);
              if (iVar1 != -1) {
                __assert_fail("ret == -1",
                              "/workspace/llm4binary/github/license_c_cmakelists/Evgueni-Petrov-aka-espetrov[P]TestDriver/testDriver.c"
                              ,0x218,"int _LaunchLabExecutable(char *)");
              }
              pcVar13 = "execl";
            }
            ReportSystemError(pcVar13);
            exit(1);
          }
          memset(&rusage,0,0x90);
          iVar1 = GetTimeout();
          local_200.tv_sec = (long)(iVar1 / 1000);
          iVar6 = GetTimeout();
          local_200.tv_nsec = (long)((iVar6 % 1000) * 1000000);
          lVar12 = (long)(iVar1 / 1000);
          do {
            if ((lVar12 < 1) && (local_200.tv_nsec < 1)) {
LAB_00102aa0:
              iVar1 = GetTimeout();
              PrintWithoutBuffering
                        ("\nExecutable file \"%s\" didn\'t terminate in %d seconds\n",pcVar13,
                         (ulong)(iVar1 + 999) / 1000);
              iVar1 = kill(__pid,9);
              if (iVar1 == 0) goto LAB_00102b12;
              pcVar13 = "kill";
              goto LAB_00102b0d;
            }
            local_210 = 0;
            _Var7 = wait4(__pid,&local_210,1,(rusage *)&rusage);
            if (_Var7 != 0) {
              if (_Var7 == -1) {
LAB_00102b06:
                pcVar13 = "wait4";
                goto LAB_00102b0d;
              }
              if ((local_210 & 0x7f) == 0) {
                if ((local_210 & 0xff00) == 0) {
                  sVar9 = GetMemoryLimit();
                  iVar1 = 0;
                  if ((ulong)(rusage.field_2.ru_maxrss << 10) <= sVar9) goto LAB_00102b16;
                  sVar9 = GetMemoryLimit();
                  PrintWithoutBuffering
                            ("\nExecutable file \"%s\" used %dKB > %dKB\n",pcVar13,
                             (ulong)((uint)(rusage.field_2.ru_maxrss << 10) | 0x3e0) / 1000,
                             (ulong)((int)sVar9 + 999) / 1000);
                  goto LAB_00102b12;
                }
                pcVar14 = "\nExecutable file \"%s\" terminated with return code != 0\n";
              }
              else {
                if ((int)((local_210 & 0x7f) * 0x1000000 + 0x1000000) < 0x2000000)
                goto LAB_00102b06;
                pcVar14 = "\nExecutable file \"%s\" terminated with exception\n";
              }
              PrintWithoutBuffering(pcVar14,pcVar13);
              goto LAB_00102b12;
            }
            iVar1 = nanosleep(&local_200,&local_200);
            if (iVar1 == 0) goto LAB_00102aa0;
            piVar8 = __errno_location();
            lVar12 = local_200.tv_sec;
            if (*piVar8 != 4) {
              __assert_fail("errno == EINTR",
                            "/workspace/llm4binary/github/license_c_cmakelists/Evgueni-Petrov-aka-espetrov[P]TestDriver/testDriver.c"
                            ,0x1ee,"int WaitForProcess(pid_t, struct timespec *, struct rusage *)");
            }
          } while( true );
        }
        pcVar13 = "fork";
      }
LAB_00102b0d:
      ReportSystemError(pcVar13);
LAB_00102b12:
      iVar1 = 1;
LAB_00102b16:
      iVar6 = sigaction(0x11,&local_160,(sigaction *)0x0);
      if (iVar6 == 0) {
        return iVar1;
      }
    }
    ReportSystemError("sigaction");
    return -1;
  }
LAB_00102721:
  PrintWithoutBuffering("\nKOI FIT NSU Lab Tester (c) 2009-2020 by Evgueni Petrov\n");
  if (argc < 2) {
    pcVar14 = "\nTo test mylab.exe, do %s mylab.exe\n";
    pcVar13 = local_208;
  }
  else {
    pcVar13 = GetTesterName();
    PrintWithoutBuffering("\nTesting %s...\n",pcVar13);
    iVar1 = 0;
    testIdx = 0;
    while (iVar6 = GetTestCount(), (int)testIdx < iVar6) {
      uVar2 = GetTestCount();
      local_20c = testIdx + 1;
      iVar6 = 0;
      PrintWithoutBuffering("TEST %d/%d: ",(ulong)local_20c,(ulong)uVar2);
      TVar15 = GetLabTest(testIdx);
      iVar3 = (*TVar15.Feeder)();
      if ((iVar3 != 0) && (iVar6 = -1, UserTestAll != '\x01')) break;
      pcVar13 = ppcVar11[1];
      sVar9 = GetMemoryLimit();
      uVar2 = GetTimeout();
      iVar3 = snprintf(GetRunnerCommand_runnerCommand,0x1000,"%s -m %zu -t %d -e %s",local_208,
                       sVar9 + 0x3ff >> 10,(ulong)uVar2,pcVar13);
      if (iVar3 < 0) {
        pcVar13 = "\nInternal error: snprintf returned negative value\n";
LAB_00102a02:
        PrintWithoutBuffering(pcVar13);
        break;
      }
      if (iVar3 == 0xfff) {
        pcVar13 = "\nInternal error: snprintf stopped at the end of buffer\n";
        goto LAB_00102a02;
      }
      DVar4 = GetTickCount();
      iVar3 = system(GetRunnerCommand_runnerCommand);
      if (iVar3 != 0) break;
      DVar5 = GetTickCount();
      PrintWithoutBuffering("%.0f ms, ",(double)((int)((DVar5 - DVar4) + 86400000) % 86400000));
      TVar15 = GetLabTest(testIdx);
      iVar3 = (*TVar15.Checker)();
      if ((iVar3 != 0) && (iVar6 = -1, UserTestAll != '\x01')) break;
      iVar1 = iVar1 + iVar6 + 1;
      testIdx = local_20c;
    }
    iVar6 = GetTestCount();
    pcVar13 = ppcVar11[1];
    if (iVar6 <= iVar1) {
      PrintWithoutBuffering
                ("\n:-)\n\nExecutable file %s passed all tests.\nPlease review the source code with your teaching assistant.\n"
                 ,pcVar13);
      return 0;
    }
    pcVar14 = 
    "\n:-(\n\nExecutable file %s failed for input file in.txt in the current directory.\nPlease fix and try again.\n"
    ;
  }
  PrintWithoutBuffering(pcVar14,pcVar13);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
    int i, count, fail;
    const char* runnerExe = argv[0];

    if (argc >= 3 && strcmp(argv[1], "-a") == 0) {
        UserTestAll = 1;
        argv++;
        argc--;
    }
    if (argc >= 4 && strcmp(argv[1], "-m") == 0 && atoi(argv[2]) != 0) {
        UserMemoryLimit = atoi(argv[2])*1024;
        argv += 2;
        argc -= 2;
    }
    if (argc >= 4 && strcmp(argv[1], "-t") == 0 && atoi(argv[2]) != 0) {
        UserTimeout = atoi(argv[2]);
        argv += 2;
        argc -= 2;
    }
    if (argc >= 3 && strcmp(argv[1], "-e") == 0) {
        return LaunchLabExecutable(argv[2]);
    }

    PrintWithoutBuffering("\nKOI FIT NSU Lab Tester (c) 2009-2020 by Evgueni Petrov\n");

    if (argc < 2) {
        PrintWithoutBuffering("\nTo test mylab.exe, do %s mylab.exe\n", runnerExe);
        return 1;
    }

    PrintWithoutBuffering("\nTesting %s...\n", GetTesterName());

    for (i = 0, count = 0, fail = 0; i < GetTestCount(); i++, fail = 0) {
        PrintWithoutBuffering("TEST %d/%d: ", i+1, GetTestCount());
        if (GetLabTest(i).Feeder() != 0) {
            if (!UserTestAll) {
                break;
            }
            fail = 1;
        }
        const char* runnerCommand = GetRunnerCommand(runnerExe, argv[1]);
        if (!runnerCommand) {
            break;
        }
        double ms0 = GetTickCount();
        if (system(runnerCommand) != 0) {
            break;
        }
        double ms1 = GetTickCount();
        int millisecondsPerDay = 1000 * 60 * 60 * 24;
        double msElapsed = ((int)(ms1 - ms0) + millisecondsPerDay) % millisecondsPerDay;
        PrintWithoutBuffering("%.0f ms, ", msElapsed);
        if (GetLabTest(i).Checker() != 0) {
            if (!UserTestAll) {
                break;
            }
            fail = 1;
        }
        count += 1 - fail;
    }

    if (count < GetTestCount()) {
        PrintWithoutBuffering("\n:-(\n\n"
        "Executable file %s failed for input file in.txt in the current directory.\n"
        "Please fix and try again.\n", argv[1]);
        return 1;
    } else {
        PrintWithoutBuffering("\n:-)\n\n"
        "Executable file %s passed all tests.\n"
        "Please review the source code with your teaching assistant.\n", argv[1]);
        return 0;
    }
}